

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O2

void printBasic(XSObject *xsObject,char *type)

{
  XMLCh *pXVar1;
  ostream *poVar2;
  StrX local_20;
  
  std::operator<<((ostream *)&std::cout,"Name:\t\t\t");
  pXVar1 = (XMLCh *)(**(code **)(*(long *)xsObject + 0x18))(xsObject);
  if ((pXVar1 != (XMLCh *)0x0) && (*pXVar1 != L'\0')) {
    StrX::StrX(&local_20,pXVar1);
    std::operator<<((ostream *)&std::cout,local_20.fLocalForm);
    std::operator<<((ostream *)&std::cout,", ");
    StrX::~StrX(&local_20);
  }
  pXVar1 = (XMLCh *)(**(code **)(*(long *)xsObject + 0x10))(xsObject);
  StrX::StrX(&local_20,pXVar1);
  std::operator<<((ostream *)&std::cout,local_20.fLocalForm);
  std::operator<<((ostream *)&std::cout,"\n");
  StrX::~StrX(&local_20);
  poVar2 = std::operator<<((ostream *)&std::cout,"Component Type:\t");
  poVar2 = std::operator<<(poVar2,type);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void printBasic(XSObject *xsObject, const char *type)
{
    std::cout << "Name:\t\t\t";
    const XMLCh *nameSpace = xsObject->getNamespace();
    if (nameSpace && *nameSpace) {
        std::cout << StrX(nameSpace) << ", ";
    }
    std::cout << StrX(xsObject->getName()) << "\n";
    std::cout << "Component Type:\t" << type << std::endl;
}